

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void mbedtls_ssl_dtls_replay_update(mbedtls_ssl_context *ssl)

{
  uint64_t uVar1;
  ulong uVar2;
  uint64_t bit;
  uint64_t shift;
  uint64_t rec_seqnum;
  mbedtls_ssl_context *ssl_local;
  
  uVar1 = ssl_load_six_bytes(ssl->in_ctr + 2);
  if ((*(uint *)&ssl->conf->field_0x164 >> 0xc & 1) != 0) {
    if (ssl->in_window_top < uVar1) {
      uVar2 = uVar1 - ssl->in_window_top;
      if (uVar2 < 0x40) {
        ssl->in_window = ssl->in_window << ((byte)uVar2 & 0x3f);
        ssl->in_window = ssl->in_window | 1;
      }
      else {
        ssl->in_window = 1;
      }
      ssl->in_window_top = uVar1;
    }
    else {
      uVar2 = ssl->in_window_top - uVar1;
      if (uVar2 < 0x40) {
        ssl->in_window = 1L << ((byte)uVar2 & 0x3f) | ssl->in_window;
      }
    }
  }
  return;
}

Assistant:

void mbedtls_ssl_dtls_replay_update( mbedtls_ssl_context *ssl )
{
    uint64_t rec_seqnum = ssl_load_six_bytes( ssl->in_ctr + 2 );

    if( ssl->conf->anti_replay == MBEDTLS_SSL_ANTI_REPLAY_DISABLED )
        return;

    if( rec_seqnum > ssl->in_window_top )
    {
        /* Update window_top and the contents of the window */
        uint64_t shift = rec_seqnum - ssl->in_window_top;

        if( shift >= 64 )
            ssl->in_window = 1;
        else
        {
            ssl->in_window <<= shift;
            ssl->in_window |= 1;
        }

        ssl->in_window_top = rec_seqnum;
    }
    else
    {
        /* Mark that number as seen in the current window */
        uint64_t bit = ssl->in_window_top - rec_seqnum;

        if( bit < 64 ) /* Always true, but be extra sure */
            ssl->in_window |= (uint64_t) 1 << bit;
    }
}